

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar9;
  MessageGenerator *this_00;
  Descriptor *descriptor;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *psVar10;
  EnumGenerator *this_01;
  EnumDescriptor *descriptor_00;
  scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *psVar11;
  ServiceGenerator *this_02;
  ServiceDescriptor *descriptor_01;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *psVar12;
  ExtensionGenerator *this_03;
  FieldDescriptor *descriptor_02;
  string *psVar13;
  ulong uVar14;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *local_150;
  scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *local_108;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *local_c0;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *local_78;
  int local_3c;
  int local_38;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Options *options_local;
  FileDescriptor *file_local;
  FileGenerator *this_local;
  
  this->file_ = file;
  iVar5 = FileDescriptor::message_type_count(file);
  uVar6 = (ulong)iVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar7 = SUB168(auVar1 * ZEXT816(8),0);
  uVar14 = uVar7 + 8;
  if (SUB168(auVar1 * ZEXT816(8),8) != 0 || 0xfffffffffffffff7 < uVar7) {
    uVar14 = 0xffffffffffffffff;
  }
  puVar8 = (ulong *)operator_new__(uVar14);
  *puVar8 = uVar6;
  psVar9 = (scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *)(puVar8 + 1);
  if (uVar6 != 0) {
    local_78 = psVar9;
    do {
      internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::scoped_ptr
                (local_78,(MessageGenerator *)0x0);
      local_78 = local_78 + 1;
    } while (local_78 != psVar9 + uVar6);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
  ::scoped_array(&this->message_generators_,psVar9);
  iVar5 = FileDescriptor::enum_type_count(file);
  uVar6 = (ulong)iVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6;
  uVar7 = SUB168(auVar2 * ZEXT816(8),0);
  uVar14 = uVar7 + 8;
  if (0xfffffffffffffff7 < uVar7) {
    uVar14 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  puVar8 = (ulong *)operator_new__(uVar14);
  *puVar8 = uVar6;
  psVar10 = (scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *)(puVar8 + 1);
  if (uVar6 != 0) {
    local_c0 = psVar10;
    do {
      internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::scoped_ptr
                (local_c0,(EnumGenerator *)0x0);
      local_c0 = local_c0 + 1;
    } while (local_c0 != psVar10 + uVar6);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
  ::scoped_array(&this->enum_generators_,psVar10);
  iVar5 = FileDescriptor::service_count(file);
  uVar6 = (ulong)iVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar6;
  uVar7 = SUB168(auVar3 * ZEXT816(8),0);
  uVar14 = uVar7 + 8;
  if (0xfffffffffffffff7 < uVar7) {
    uVar14 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  puVar8 = (ulong *)operator_new__(uVar14);
  *puVar8 = uVar6;
  psVar11 = (scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *)(puVar8 + 1);
  if (uVar6 != 0) {
    local_108 = psVar11;
    do {
      internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>::scoped_ptr
                (local_108,(ServiceGenerator *)0x0);
      local_108 = local_108 + 1;
    } while (local_108 != psVar11 + uVar6);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
  ::scoped_array(&this->service_generators_,psVar11);
  iVar5 = FileDescriptor::extension_count(file);
  uVar6 = (ulong)iVar5;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar6;
  uVar7 = SUB168(auVar4 * ZEXT816(8),0);
  uVar14 = uVar7 + 8;
  if (0xfffffffffffffff7 < uVar7) {
    uVar14 = 0xffffffffffffffff;
  }
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  puVar8 = (ulong *)operator_new__(uVar14);
  *puVar8 = uVar6;
  psVar12 = (scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *)(puVar8 + 1);
  if (uVar6 != 0) {
    local_150 = psVar12;
    do {
      internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::scoped_ptr
                (local_150,(ExtensionGenerator *)0x0);
      local_150 = local_150 + 1;
    } while (local_150 != psVar12 + uVar6);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
  ::scoped_array(&this->extension_generators_,psVar12);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->package_parts_);
  Options::Options(&this->options_,options);
  i_2 = 0;
  while( true ) {
    iVar5 = FileDescriptor::message_type_count(file);
    if (iVar5 <= i_2) break;
    psVar9 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::operator[](&this->message_generators_,(long)i_2);
    this_00 = (MessageGenerator *)operator_new(0x78);
    descriptor = FileDescriptor::message_type(file,i_2);
    MessageGenerator::MessageGenerator(this_00,descriptor,options);
    internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::reset(psVar9,this_00);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar5 = FileDescriptor::enum_type_count(file);
    if (iVar5 <= i_3) break;
    psVar10 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
              ::operator[](&this->enum_generators_,(long)i_3);
    this_01 = (EnumGenerator *)operator_new(0x50);
    descriptor_00 = FileDescriptor::enum_type(file,i_3);
    EnumGenerator::EnumGenerator(this_01,descriptor_00,options);
    internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::reset(psVar10,this_01);
    i_3 = i_3 + 1;
  }
  local_38 = 0;
  while( true ) {
    iVar5 = FileDescriptor::service_count(file);
    if (iVar5 <= local_38) break;
    psVar11 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
              ::operator[](&this->service_generators_,(long)local_38);
    this_02 = (ServiceGenerator *)operator_new(0x38);
    descriptor_01 = FileDescriptor::service(file,local_38);
    ServiceGenerator::ServiceGenerator(this_02,descriptor_01,options);
    internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>::reset(psVar11,this_02);
    local_38 = local_38 + 1;
  }
  local_3c = 0;
  while( true ) {
    iVar5 = FileDescriptor::extension_count(file);
    if (iVar5 <= local_3c) break;
    psVar12 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,(long)local_3c);
    this_03 = (ExtensionGenerator *)operator_new(0x50);
    descriptor_02 = FileDescriptor::extension(file,local_3c);
    ExtensionGenerator::ExtensionGenerator(this_03,descriptor_02,options);
    internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::reset
              (psVar12,this_03);
    local_3c = local_3c + 1;
  }
  psVar13 = FileDescriptor::package_abi_cxx11_(this->file_);
  google::protobuf::SplitStringUsing((string *)psVar13,".",(vector *)&this->package_parts_);
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file,
                             const Options& options)
  : file_(file),
    message_generators_(
      new scoped_ptr<MessageGenerator>[file->message_type_count()]),
    enum_generators_(
      new scoped_ptr<EnumGenerator>[file->enum_type_count()]),
    service_generators_(
      new scoped_ptr<ServiceGenerator>[file->service_count()]),
    extension_generators_(
      new scoped_ptr<ExtensionGenerator>[file->extension_count()]),
    options_(options) {

  for (int i = 0; i < file->message_type_count(); i++) {
    message_generators_[i].reset(
      new MessageGenerator(file->message_type(i), options));
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    enum_generators_[i].reset(
      new EnumGenerator(file->enum_type(i), options));
  }

  for (int i = 0; i < file->service_count(); i++) {
    service_generators_[i].reset(
      new ServiceGenerator(file->service(i), options));
  }

  for (int i = 0; i < file->extension_count(); i++) {
    extension_generators_[i].reset(
      new ExtensionGenerator(file->extension(i), options));
  }

  SplitStringUsing(file_->package(), ".", &package_parts_);
}